

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testInputPart.cpp
# Opt level: O2

void anon_unknown.dwarf_1e2dea::fillPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  
  Imf_3_4::Array2D<Imath_3_2::half>::resizeErase(ph,(long)height,(long)width);
  uVar1 = 0;
  iVar5 = width;
  if (width < 1) {
    iVar5 = 0;
  }
  uVar3 = (ulong)(uint)height;
  if (height < 1) {
    uVar3 = uVar1;
  }
  lVar7 = 0;
  for (uVar2 = 0; uVar2 != uVar3; uVar2 = uVar2 + 1) {
    uVar4 = uVar1;
    for (uVar6 = 0; (uint)(iVar5 * 2) != uVar6; uVar6 = uVar6 + 2) {
      Imath_3_2::half::operator=
                ((half *)((long)&ph->_data->_h + uVar6 + ph->_sizeY * lVar7),
                 (float)((int)uVar4 % 0x801));
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    lVar7 = lVar7 + 2;
    uVar1 = (ulong)(uint)((int)uVar1 + width);
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}